

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O3

KeyID __thiscall
anon_unknown.dwarf_5401fb::SQLiteBuildDB::getKeyIDForID
          (SQLiteBuildDB *this,DBKeyID dbKeyID,string *error_out)

{
  BuildDBDelegate *pBVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ValueTy VVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  KeyID KVar8;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *ConstFoundBucket;
  string local_60;
  DBKeyID local_40;
  KeyID local_38;
  undefined4 extraout_var;
  
  local_40.value = dbKeyID.value;
  bVar2 = llvm::
          DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
          ::LookupBucketFor<DBKeyID>
                    ((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                      *)&this->engineKeyIDs,&local_40,
                     (DenseMapPair<DBKeyID,_llbuild::core::KeyID> **)&local_60);
  if ((bVar2) &&
     ((DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)local_60._M_dataplus._M_p !=
      (this->engineKeyIDs).Buckets + (this->engineKeyIDs).NumBuckets)) {
    KVar8._value = ((KeyID *)(local_60._M_dataplus._M_p + 8))->_value;
  }
  else {
    iVar3 = sqlite3_reset(this->findKeyNameForKeyIDStmt);
    if ((iVar3 == 0) &&
       (((iVar3 = sqlite3_clear_bindings(this->findKeyNameForKeyIDStmt), iVar3 == 0 &&
         (iVar3 = sqlite3_bind_int64(this->findKeyNameForKeyIDStmt,1,local_40.value), iVar3 == 0))
        && (iVar3 = sqlite3_step(this->findKeyNameForKeyIDStmt), iVar3 == 100)))) {
      iVar3 = sqlite3_column_count(this->findKeyNameForKeyIDStmt);
      if (iVar3 == 1) {
        iVar3 = sqlite3_column_bytes(this->findKeyNameForKeyIDStmt,0);
        lVar4 = sqlite3_column_text(this->findKeyNameForKeyIDStmt,0);
        pBVar1 = this->delegate;
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,lVar4,iVar3 + lVar4);
        iVar3 = (*pBVar1->_vptr_BuildDBDelegate[2])(pBVar1,&local_60);
        VVar5 = CONCAT44(extraout_var,iVar3);
        local_38._value = VVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pvVar6 = llvm::
                 DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                 ::FindAndConstruct((DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                                     *)&this->engineKeyIDs,&local_40);
        (pvVar6->super_pair<DBKeyID,_llbuild::core::KeyID>).second._value = VVar5;
        pvVar7 = llvm::
                 DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                 ::FindAndConstruct((DenseMapBase<llvm::DenseMap<llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>,_llbuild::core::KeyID,_DBKeyID,_llvm::DenseMapInfo<llbuild::core::KeyID>,_llvm::detail::DenseMapPair<llbuild::core::KeyID,_DBKeyID>_>
                                     *)&this->dbKeyIDs,&local_38);
        (pvVar7->super_pair<llbuild::core::KeyID,_DBKeyID>).second.value = local_40.value;
        return (KeyID)local_38._value;
      }
      __assert_fail("sqlite3_column_count(findKeyNameForKeyIDStmt) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/SQLiteBuildDB.cpp"
                    ,0x3cf,
                    "KeyID (anonymous namespace)::SQLiteBuildDB::getKeyIDForID(DBKeyID, std::string *)"
                   );
    }
    (anonymous_namespace)::SQLiteBuildDB::getCurrentErrorMessage_abi_cxx11_(&local_60,this);
    std::__cxx11::string::operator=((string *)error_out,(string *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    KVar8._value = 0;
  }
  return (KeyID)KVar8._value;
}

Assistant:

KeyID getKeyIDForID(DBKeyID dbKeyID, std::string *error_out) {
#define checkSQLiteResultOKReturnKeyID(result) \
if (result != SQLITE_OK) { \
  *error_out = getCurrentErrorMessage(); \
  return KeyID(); \
}

    // Search local db <-> engine mapping cache
    auto it = engineKeyIDs.find(dbKeyID);
    if (it != engineKeyIDs.end())
      return it->second;

    // Search for the key in the database
    int result;
    result = sqlite3_reset(findKeyNameForKeyIDStmt);
    checkSQLiteResultOKReturnKeyID(result);
    result = sqlite3_clear_bindings(findKeyNameForKeyIDStmt);
    checkSQLiteResultOKReturnKeyID(result);
    result = sqlite3_bind_int64(findKeyNameForKeyIDStmt, /*index=*/1, dbKeyID.value);
    checkSQLiteResultOKReturnKeyID(result);

    result = sqlite3_step(findKeyNameForKeyIDStmt);
    if (result != SQLITE_ROW) {
      *error_out = getCurrentErrorMessage();
      return KeyID();
    }
    assert(sqlite3_column_count(findKeyNameForKeyIDStmt) == 1);

    // Found a key
    auto size = sqlite3_column_bytes(findKeyNameForKeyIDStmt, 0);
    auto text = (const char*) sqlite3_column_text(findKeyNameForKeyIDStmt, 0);

    // Map the key to an engine ID
    auto engineKeyID = delegate->getKeyID(KeyType(text, size));

    // Cache the mapping locally
    engineKeyIDs[dbKeyID] = engineKeyID;
    dbKeyIDs[engineKeyID] = dbKeyID;

    return engineKeyID;
#undef checkSQLiteResultOKReturnKeyID
  }